

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t>
          (AggregateFunction *__return_storage_ptr__,duckdb *this,LogicalType *by_type,
          LogicalType *type)

{
  duckdb dVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38 [32];
  
  dVar1 = this[1];
  if (dVar1 == (duckdb)0xcc) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t,duckdb::hugeint_t>
              (__return_storage_ptr__,this,by_type,type);
  }
  else if (dVar1 == (duckdb)0x9) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t,long>
              (__return_storage_ptr__,this,by_type,type);
  }
  else if (dVar1 == (duckdb)0xc) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t,double>
              (__return_storage_ptr__,this,by_type,type);
  }
  else if (dVar1 == (duckdb)0xc8) {
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t,duckdb::string_t>
              (__return_storage_ptr__,this,by_type,type);
  }
  else {
    if (dVar1 != (duckdb)0x7) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string(local_38,"Unimplemented arg_min/arg_max by aggregate",&local_39);
      duckdb::InternalException::InternalException(this_00,local_38);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    GetArgMinMaxFunctionInternal<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::string_t,int>
              (__return_storage_ptr__,this,by_type,type);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetArgMinMaxFunctionBy(const LogicalType &by_type, const LogicalType &type) {
	switch (by_type.InternalType()) {
	case PhysicalType::INT32:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, int32_t>(by_type, type);
	case PhysicalType::INT64:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, int64_t>(by_type, type);
	case PhysicalType::INT128:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, hugeint_t>(by_type, type);
	case PhysicalType::DOUBLE:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, double>(by_type, type);
	case PhysicalType::VARCHAR:
		return GetArgMinMaxFunctionInternal<OP, ARG_TYPE, string_t>(by_type, type);
	default:
		throw InternalException("Unimplemented arg_min/arg_max by aggregate");
	}
}